

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  char *pcVar4;
  reference ppcVar5;
  cmake *this_00;
  cmGlobalGenerator *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  value_type local_778;
  value_type local_750;
  value_type local_6d0;
  value_type local_6a8;
  char *local_6a0;
  char *local_698;
  allocator<char> local_631;
  string local_630;
  char *local_610;
  char *labelsForSubprojects;
  string local_600;
  char *local_5e0;
  char *useLaunchers;
  ostringstream local_5b8 [8];
  ostringstream ostr;
  string local_440 [32];
  undefined1 local_420 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  undefined1 local_230 [8];
  string buildCommand;
  string local_208;
  undefined1 local_1e8 [8];
  string dir;
  char *config;
  undefined1 local_1b8 [8];
  string e;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  byte local_14b;
  byte local_14a;
  allocator<char> local_149;
  string local_148;
  value_type local_128;
  char *cmakeBuildTarget;
  string local_118;
  value_type local_f8;
  char *cmakeBuildAdditionalFlags;
  char *cmakeBuildConfiguration;
  string local_e0;
  char *local_c0;
  char *ctestBuildConfiguration;
  string local_b0;
  char *local_90;
  char *cmakeGeneratorName;
  string local_80;
  char *local_60;
  char *ctestBuildCommand;
  allocator<char> local_41;
  string local_40;
  cmCTestBuildHandler *local_20;
  cmCTestGenericHandler *handler;
  cmCTestBuildCommand *this_local;
  
  handler = (cmCTestGenericHandler *)this;
  local_20 = (cmCTestBuildHandler *)
             cmCTest::GetInitializedHandler
                       ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  if (local_20 == (cmCTestBuildHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"internal CTest error. Cannot instantiate build handler",
               &local_41);
    cmCommand::SetError((cmCommand *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (cmCTestBuildCommand *)0x0;
  }
  else {
    this->Handler = local_20;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CTEST_BUILD_COMMAND",
               (allocator<char> *)((long)&cmakeGeneratorName + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorName + 7));
    local_60 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CTEST_CMAKE_GENERATOR",
                 (allocator<char> *)((long)&ctestBuildConfiguration + 7));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ctestBuildConfiguration + 7));
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_90 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"CTEST_BUILD_CONFIGURATION",
                 (allocator<char> *)((long)&cmakeBuildConfiguration + 7));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildConfiguration + 7));
      local_c0 = pcVar4;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,10);
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,10), **ppcVar5 == '\0'))
      {
        if ((local_c0 == (char *)0x0) || (*local_c0 == '\0')) {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          local_6a0 = (char *)std::__cxx11::string::c_str();
        }
        else {
          local_6a0 = local_c0;
        }
        local_698 = local_6a0;
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,10);
        local_698 = *ppcVar5;
      }
      cmakeBuildAdditionalFlags = local_698;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0xb);
      cmakeBuildTarget._6_1_ = 0;
      cmakeBuildTarget._5_1_ = 0;
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,0xb), **ppcVar5 == '\0'))
      {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        cmakeBuildTarget._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"CTEST_BUILD_FLAGS",
                   (allocator<char> *)((long)&cmakeBuildTarget + 7));
        cmakeBuildTarget._5_1_ = 1;
        local_6a8 = cmMakefile::GetDefinition(pcVar1,&local_118);
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,0xb);
        local_6a8 = *ppcVar5;
      }
      if ((cmakeBuildTarget._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_118);
      }
      if ((cmakeBuildTarget._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildTarget + 7));
      }
      local_f8 = local_6a8;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,9);
      local_14a = 0;
      local_14b = 0;
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,9), **ppcVar5 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        local_14a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"CTEST_BUILD_TARGET",&local_149);
        local_14b = 1;
        local_6d0 = cmMakefile::GetDefinition(pcVar1,&local_148);
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,9);
        local_6d0 = *ppcVar5;
      }
      if ((local_14b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_148);
      }
      if ((local_14a & 1) != 0) {
        std::allocator<char>::~allocator(&local_149);
      }
      local_128 = local_6d0;
      if ((local_90 == (char *)0x0) || (*local_90 == '\0')) {
        std::__cxx11::ostringstream::ostringstream(local_5b8);
        std::operator<<((ostream *)local_5b8,
                        "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                       );
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)&useLaunchers);
        std::__cxx11::string::~string((string *)&useLaunchers);
        this_local = (cmCTestBuildCommand *)0x0;
        std::__cxx11::ostringstream::~ostringstream(local_5b8);
        return (cmCTestGenericHandler *)this_local;
      }
      if (cmakeBuildAdditionalFlags == (char *)0x0) {
        cmakeBuildAdditionalFlags = "Release";
      }
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])();
        bVar3 = std::operator!=(&local_170,local_90);
        std::__cxx11::string::~string((string *)&local_170);
        if (bVar3) {
          if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
            (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
        }
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        pcVar4 = local_90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,pcVar4,(allocator<char> *)(e.field_2._M_local_buf + 0xf));
        pcVar6 = cmake::CreateGlobalGenerator(this_00,&local_190);
        this->GlobalGenerator = pcVar6;
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
        if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b8,"could not create generator named \"",
                     (allocator<char> *)((long)&config + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
          std::__cxx11::string::operator+=((string *)local_1b8,local_90);
          std::__cxx11::string::operator+=((string *)local_1b8,"\"");
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,(string *)local_1b8);
          cmSystemTools::SetFatalErrorOccured();
          this_local = (cmCTestBuildCommand *)0x0;
          std::__cxx11::string::~string((string *)local_1b8);
          return (cmCTestGenericHandler *)this_local;
        }
      }
      sVar7 = strlen(cmakeBuildAdditionalFlags);
      if (sVar7 == 0) {
        dir.field_2._8_8_ = (long)"/Debug" + 1;
        cmakeBuildAdditionalFlags = "Debug";
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"BuildDirectory",
                 (allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf));
      cmCTest::GetCTestConfiguration((string *)local_1e8,pcVar2,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf))
      ;
      pcVar6 = this->GlobalGenerator;
      if (local_128 == (value_type)0x0) {
        local_750 = "";
      }
      else {
        local_750 = local_128;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,local_750,&local_251);
      pcVar4 = cmakeBuildAdditionalFlags;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar4,&local_279);
      if (local_f8 == (value_type)0x0) {
        local_778 = "";
      }
      else {
        local_778 = local_f8;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,local_778,&local_2a1);
      bVar3 = cmMakefile::IgnoreErrorsCMP0061
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                ((string *)local_230,pcVar6,&local_250,&local_278,&local_2a0,bVar3);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
      poVar8 = std::operator<<((ostream *)local_420,"SetMakeCommand:");
      poVar8 = std::operator<<(poVar8,(string *)local_230);
      std::operator<<(poVar8,"\n");
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x7b,pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string(local_440);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetCTestConfiguration
                (pcVar2,"MakeCommand",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::string::~string((string *)local_1e8);
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar4
                 ,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"CTEST_USE_LAUNCHERS",
               (allocator<char> *)((long)&labelsForSubprojects + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects + 7));
    local_5e0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"CTEST_LABELS_FOR_SUBPROJECTS",&local_631);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    local_610 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                 "LabelsForSubprojects",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1)
                );
    }
    cmCTestGenericHandler::SetQuiet
              (&local_20->super_cmCTestGenericHandler,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    this_local = (cmCTestBuildCommand *)local_20;
  }
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler = this->CTest->GetInitializedHandler("build");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return nullptr;
  }
  this->Handler = static_cast<cmCTestBuildHandler*>(handler);

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = nullptr;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return nullptr;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = nullptr;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}